

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

int secp256k1_wnaf_fixed(int *wnaf,secp256k1_scalar *s,int w)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  
  if (((s->d[1] == 0 && s->d[2] == 0) && s->d[3] == 0) && s->d[0] == 0) {
    if ((int)(0x7f / (long)w) < 0) {
      return 0;
    }
    memset(wnaf,0,(0x7f / (long)w & 0xffffffffU) * 4 + 4);
    return 0;
  }
  uVar2 = (uint)s->d[0];
  bVar4 = (byte)w;
  uVar6 = ~uVar2 & 1;
  *wnaf = ((uVar2 << (-bVar4 & 0x1f)) >> (-bVar4 & 0x1f)) + uVar6;
  iVar9 = (int)(0x7f / (long)w);
  if (iVar9 < 1) {
    return uVar6;
  }
  uVar8 = 0x7f / (long)w & 0xffffffff;
  uVar2 = iVar9 * w;
  iVar9 = 0x80 - uVar2;
  uVar12 = uVar8 + 1;
  lVar10 = 0;
  while( true ) {
    iVar5 = w;
    if (lVar10 == 0) {
      iVar5 = iVar9;
    }
    uVar7 = (iVar5 + uVar2) - 1 >> 6;
    uVar13 = uVar2 >> 6;
    if (uVar7 == uVar13) {
      uVar7 = (uint)(s->d[uVar7] >> ((byte)uVar2 & 0x3f));
    }
    else {
      bVar1 = (byte)uVar2 & 0x3f;
      uVar7 = (uint)(s->d[uVar13] >> bVar1) | (uint)(s->d[(ulong)uVar13 + 1] << 0x40 - bVar1);
    }
    if (uVar7 << (-(char)iVar5 & 0x1fU) != 0) break;
    wnaf[uVar12 - 1] = 0;
    uVar12 = uVar12 - 1;
    uVar2 = uVar2 - w;
    lVar10 = lVar10 + 1;
    if ((long)uVar12 < 2) {
      return uVar6;
    }
  }
  if (uVar12 == 1 || (long)(uVar12 - 1) < 0) {
    return uVar6;
  }
  iVar5 = -1 << (bVar4 & 0x1f);
  uVar14 = 1;
  uVar2 = w;
  do {
    iVar3 = w;
    if (uVar8 == uVar14) {
      iVar3 = iVar9;
    }
    uVar7 = (iVar3 + uVar2) - 1 >> 6;
    uVar13 = uVar2 >> 6;
    if (uVar7 == uVar13) {
      uVar11 = s->d[uVar7] >> ((byte)uVar2 & 0x3f);
    }
    else {
      bVar1 = (byte)uVar2 & 0x3f;
      uVar11 = s->d[uVar13] >> bVar1 | s->d[(ulong)uVar13 + 1] << 0x40 - bVar1;
    }
    uVar7 = (uint)((int)uVar11 << (-(char)iVar3 & 0x1fU)) >> (-(char)iVar3 & 0x1fU);
    if ((uVar11 & 1) == 0) {
      wnaf[uVar14 - 1] = wnaf[uVar14 - 1] + iVar5;
      uVar7 = uVar7 | 1;
    }
    wnaf[uVar14] = uVar7;
    if (1 < uVar14) {
      if (wnaf[uVar14 - 1] == -1) {
        if (0 < wnaf[uVar14 - 2]) {
          iVar3 = wnaf[uVar14 - 2] + iVar5;
          goto LAB_001693ff;
        }
      }
      else if ((wnaf[uVar14 - 1] == 1) && (wnaf[uVar14 - 2] < 0)) {
        iVar3 = wnaf[uVar14 - 2] + (1 << (bVar4 & 0x1f));
LAB_001693ff:
        wnaf[uVar14 - 2] = iVar3;
        wnaf[uVar14 - 1] = 0;
      }
    }
    uVar14 = uVar14 + 1;
    uVar2 = uVar2 + w;
    if ((uVar12 & 0xffffffff) == uVar14) {
      return uVar6;
    }
  } while( true );
}

Assistant:

static int secp256k1_wnaf_fixed(int *wnaf, const secp256k1_scalar *s, int w) {
    int skew = 0;
    int pos;
    int max_pos;
    int last_w;
    const secp256k1_scalar *work = s;

    if (secp256k1_scalar_is_zero(s)) {
        for (pos = 0; pos < WNAF_SIZE(w); pos++) {
            wnaf[pos] = 0;
        }
        return 0;
    }

    if (secp256k1_scalar_is_even(s)) {
        skew = 1;
    }

    wnaf[0] = secp256k1_scalar_get_bits_var(work, 0, w) + skew;
    /* Compute last window size. Relevant when window size doesn't divide the
     * number of bits in the scalar */
    last_w = WNAF_BITS - (WNAF_SIZE(w) - 1) * w;

    /* Store the position of the first nonzero word in max_pos to allow
     * skipping leading zeros when calculating the wnaf. */
    for (pos = WNAF_SIZE(w) - 1; pos > 0; pos--) {
        int val = secp256k1_scalar_get_bits_var(work, pos * w, pos == WNAF_SIZE(w)-1 ? last_w : w);
        if(val != 0) {
            break;
        }
        wnaf[pos] = 0;
    }
    max_pos = pos;
    pos = 1;

    while (pos <= max_pos) {
        int val = secp256k1_scalar_get_bits_var(work, pos * w, pos == WNAF_SIZE(w)-1 ? last_w : w);
        if ((val & 1) == 0) {
            wnaf[pos - 1] -= (1 << w);
            wnaf[pos] = (val + 1);
        } else {
            wnaf[pos] = val;
        }
        /* Set a coefficient to zero if it is 1 or -1 and the proceeding digit
         * is strictly negative or strictly positive respectively. Only change
         * coefficients at previous positions because above code assumes that
         * wnaf[pos - 1] is odd.
         */
        if (pos >= 2 && ((wnaf[pos - 1] == 1 && wnaf[pos - 2] < 0) || (wnaf[pos - 1] == -1 && wnaf[pos - 2] > 0))) {
            if (wnaf[pos - 1] == 1) {
                wnaf[pos - 2] += 1 << w;
            } else {
                wnaf[pos - 2] -= 1 << w;
            }
            wnaf[pos - 1] = 0;
        }
        ++pos;
    }

    return skew;
}